

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O1

REF_STATUS ref_import_su2(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_DBL *pRVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  FILE *__stream;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  REF_DBL *pRVar10;
  undefined8 uVar11;
  ulong uVar12;
  REF_DBL RVar13;
  REF_INT cell_type;
  REF_INT new_cell;
  REF_INT new_node;
  REF_DBL y;
  REF_DBL x;
  REF_DBL z;
  char line [1024];
  int local_4f8;
  REF_INT local_4f4;
  REF_GRID_conflict local_4f0;
  uint local_4e8;
  int local_4e4;
  REF_NODE local_4e0;
  undefined8 local_4d8;
  int local_4d0;
  undefined8 local_4cc;
  undefined1 local_4c4 [4];
  undefined1 local_4c0 [4];
  undefined1 local_4bc [92];
  ulong local_460;
  REF_DBL local_458;
  REF_DBL local_450;
  uint local_444;
  REF_DBL local_440;
  char local_438 [1032];
  
  uVar2 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar2 == 0) {
    local_4f0 = *ref_grid_ptr;
    local_4e0 = local_4f0->node;
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      pcVar7 = "unable to open file";
      uVar11 = 0x333;
LAB_001aae97:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar11,"ref_import_su2",pcVar7);
      uVar2 = 2;
    }
    else {
      local_4e8 = 0xffffffff;
      uVar2 = 0;
      while (iVar3 = feof(__stream), iVar3 == 0) {
        pcVar7 = fgets(local_438,0x400,__stream);
        if (local_438 != pcVar7) goto LAB_001aaeae;
        pcVar7 = strchr(local_438,0x3d);
        if (pcVar7 != (char *)0x0) {
          pcVar8 = strstr(local_438,"NDIME");
          if (pcVar8 != (char *)0x0) {
            uVar4 = atoi(pcVar7 + 1);
            printf("NDIME %d\n",(ulong)uVar4);
            local_4e8 = uVar4;
            if (uVar4 == 2) {
              local_4f0->twod = 1;
              local_4e8 = 2;
            }
          }
          pcVar8 = strstr(local_438,"NPOIN");
          if (pcVar8 != (char *)0x0) {
            uVar4 = atoi(pcVar7 + 1);
            printf("NPOIN %d\n",(ulong)uVar4);
            local_444 = uVar4;
            if (0 < (int)uVar4) {
              local_460 = (ulong)uVar4;
              uVar12 = 0;
              do {
                pcVar8 = fgets(local_438,0x400,__stream);
                if (local_438 != pcVar8) {
                  pcVar7 = "unable to read point xyz line";
                  uVar11 = 0x345;
                  goto LAB_001ab02a;
                }
                if (local_4e8 == 2) {
                  iVar3 = __isoc99_sscanf(local_438,"%lf %lf",&local_450,&local_458);
                  if (iVar3 != 2) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x347,"ref_import_su2","parse xyz",2,(long)iVar3);
                    return 1;
                  }
                  uVar4 = ref_node_add(local_4e0,uVar12,&local_4e4);
                  if (uVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x348,"ref_import_su2",(ulong)uVar4,"add node");
                    return uVar4;
                  }
                  pRVar1 = local_4e0->real;
                  lVar9 = (long)local_4e4;
                  pRVar10 = pRVar1 + lVar9 * 0xf;
                  pRVar1[lVar9 * 0xf] = local_450;
                  pRVar1[lVar9 * 0xf + 1] = local_458;
                  RVar13 = 0.0;
                }
                else {
                  iVar3 = __isoc99_sscanf(local_438,"%lf %lf %lf",&local_450,&local_458,&local_440);
                  if (iVar3 != 3) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x34d,"ref_import_su2","parse xyz",3,(long)iVar3);
                    return 1;
                  }
                  uVar4 = ref_node_add(local_4e0,uVar12,&local_4e4);
                  if (uVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x34e,"ref_import_su2",(ulong)uVar4,"add node");
                    return uVar4;
                  }
                  pRVar1 = local_4e0->real;
                  lVar9 = (long)local_4e4;
                  pRVar10 = pRVar1 + lVar9 * 0xf;
                  pRVar1[lVar9 * 0xf] = local_450;
                  pRVar1[lVar9 * 0xf + 1] = local_458;
                  RVar13 = local_440;
                }
                pRVar10[2] = RVar13;
                uVar12 = uVar12 + 1;
              } while (local_460 != uVar12);
            }
            uVar4 = ref_node_initialize_n_global(local_4e0,(long)(int)local_444);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x354,"ref_import_su2",(ulong)uVar4,"init glob");
              return uVar4;
            }
          }
          pcVar8 = strstr(local_438,"NELEM");
          if (pcVar8 != (char *)0x0) {
            uVar4 = atoi(pcVar7 + 1);
            printf("NELEM %d\n",(ulong)uVar4);
            if (0 < (int)uVar4) {
              do {
                pcVar8 = fgets(local_438,0x400,__stream);
                if (local_438 != pcVar8) {
                  pcVar7 = "unable to read element line";
                  uVar11 = 0x35a;
                  goto LAB_001ab02a;
                }
                iVar3 = __isoc99_sscanf(local_438,"%d",&local_4f8);
                if (iVar3 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x35b,"ref_import_su2","parse element type",1,(long)iVar3);
                  return 1;
                }
                switch(local_4f8) {
                case 5:
                  iVar3 = __isoc99_sscanf(local_438,"%d %d %d %d",&local_4f8,&local_4d8,
                                          (long)&local_4d8 + 4,&local_4d0);
                  if (iVar3 != 4) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x381,"ref_import_su2","parse marker element",4,(long)iVar3);
                    return 1;
                  }
                  local_4cc = local_4cc & 0xffffffff00000000;
                  uVar6 = ref_cell_add(local_4f0->cell[3],(REF_INT *)&local_4d8,&local_4f4);
                  if (uVar6 != 0) {
                    uVar11 = 899;
LAB_001aaa47:
                    uVar12 = (ulong)uVar6;
                    pcVar8 = "tri";
                    uVar2 = uVar6;
LAB_001aaa58:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,uVar11,"ref_import_su2",uVar12,pcVar8);
                    uVar6 = uVar2;
                  }
                  break;
                default:
                  printf("cell_type = %d\n");
                  pcVar7 = "unknown SU2/VTK ELEM type";
                  uVar11 = 0x390;
                  goto LAB_001ab02a;
                case 9:
                  iVar3 = __isoc99_sscanf(local_438,"%d %d %d %d %d",&local_4f8,&local_4d8,
                                          (long)&local_4d8 + 4,&local_4d0,&local_4cc);
                  if (iVar3 != 5) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x389,"ref_import_su2","parse marker element",5,(long)iVar3);
                    return 1;
                  }
                  local_4cc = local_4cc & 0xffffffff;
                  uVar6 = ref_cell_add(local_4f0->cell[6],(REF_INT *)&local_4d8,&local_4f4);
                  if (uVar6 != 0) {
                    uVar11 = 0x38b;
                    goto LAB_001aaa47;
                  }
                  break;
                case 10:
                  iVar3 = __isoc99_sscanf(local_438,"%d %d %d %d %d",&local_4f8,&local_4d8,
                                          (long)&local_4d8 + 4,&local_4d0,&local_4cc);
                  if (iVar3 != 5) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x361,"ref_import_su2","parse element",5,(long)iVar3);
                    return 1;
                  }
                  uVar6 = ref_cell_add(local_4f0->cell[8],(REF_INT *)&local_4d8,&local_4f4);
                  if (uVar6 != 0) {
                    uVar11 = 0x362;
                    uVar12 = (ulong)uVar6;
                    pcVar8 = "tet";
                    uVar2 = uVar6;
                    goto LAB_001aaa58;
                  }
                  break;
                case 0xc:
                  iVar3 = __isoc99_sscanf(local_438,"%d %d %d %d %d %d %d %d %d",&local_4f8,
                                          &local_4d8,(long)&local_4d8 + 4,&local_4d0,&local_4cc,
                                          (long)&local_4cc + 4,local_4c4,local_4c0,local_4bc);
                  if (iVar3 != 9) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x37a,"ref_import_su2","parse element",9,(long)iVar3);
                    return 1;
                  }
                  uVar6 = ref_cell_add(local_4f0->cell[0xb],(REF_INT *)&local_4d8,&local_4f4);
                  if (uVar6 != 0) {
                    uVar11 = 0x37b;
                    goto LAB_001aaa47;
                  }
                  break;
                case 0xd:
                  iVar3 = __isoc99_sscanf(local_438,"%d %d %d %d %d %d %d",&local_4f8,&local_4d8,
                                          (long)&local_4d8 + 4,&local_4d0,&local_4cc,
                                          (long)&local_4cc + 4,local_4c4);
                  if (iVar3 != 7) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x371,"ref_import_su2","parse element",7,(long)iVar3);
                    return 1;
                  }
                  local_4d8 = local_4d8 << 0x20 | local_4d8 >> 0x20;
                  local_4cc = local_4cc << 0x20 | local_4cc >> 0x20;
                  uVar6 = ref_cell_add(local_4f0->cell[10],(REF_INT *)&local_4d8,&local_4f4);
                  if (uVar6 != 0) {
                    uVar11 = 0x373;
                    goto LAB_001aaa47;
                  }
                  break;
                case 0xe:
                  iVar5 = __isoc99_sscanf(local_438,"%d %d %d %d %d %d",&local_4f8,&local_4d8,
                                          (long)&local_4d8 + 4,&local_4d0,&local_4cc,
                                          (long)&local_4cc + 4);
                  iVar3 = local_4d0;
                  if (iVar5 != 6) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x368,"ref_import_su2","parse element",6,(long)iVar5);
                    return 1;
                  }
                  local_4d8 = CONCAT44((REF_INT)local_4d8,local_4d8._4_4_);
                  local_4d0 = local_4cc._4_4_;
                  local_4cc = CONCAT44((undefined4)local_4cc,iVar3);
                  uVar6 = ref_cell_add(local_4f0->cell[9],(REF_INT *)&local_4d8,&local_4f4);
                  if (uVar6 != 0) {
                    uVar11 = 0x36a;
                    uVar12 = (ulong)uVar6;
                    pcVar8 = "pyr";
                    uVar2 = uVar6;
                    goto LAB_001aaa58;
                  }
                }
                if (uVar6 != 0) {
                  return uVar2;
                }
                uVar4 = uVar4 - 1;
              } while (uVar4 != 0);
            }
          }
          pcVar8 = strstr(local_438,"NMARK");
          if (pcVar8 != (char *)0x0) {
            uVar4 = atoi(pcVar7 + 1);
            printf("NMARK %d\n",(ulong)uVar4);
            if (0 < (int)uVar4) {
              uVar12 = 1;
              local_460 = CONCAT44(local_460._4_4_,uVar4);
              do {
                pcVar7 = fgets(local_438,0x400,__stream);
                if (local_438 != pcVar7) {
                  pcVar7 = "unable to read marker tag";
                  uVar11 = 0x398;
                  goto LAB_001ab02a;
                }
                iVar3 = (int)uVar12;
                printf("%d: %s",uVar12,local_438);
                pcVar7 = strstr(local_438,"MARKER_TAG");
                if (pcVar7 == (char *)0x0) {
                  pcVar7 = "MARKER_TAG not found";
                  uVar11 = 0x39a;
LAB_001ab02a:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,uVar11,"ref_import_su2",pcVar7);
                  return 1;
                }
                pcVar7 = fgets(local_438,0x400,__stream);
                if (local_438 != pcVar7) {
                  pcVar7 = "unable to read marker elems";
                  uVar11 = 0x39b;
                  goto LAB_001ab02a;
                }
                pcVar7 = strstr(local_438,"MARKER_ELEMS");
                if (pcVar7 == (char *)0x0) {
                  pcVar7 = "MARKER_ELEMS not found";
                  uVar11 = 0x39c;
                  goto LAB_001ab02a;
                }
                pcVar7 = strchr(local_438,0x3d);
                if (pcVar7 == (char *)0x0) {
                  pcVar7 = "MARKER_ELEMS missing =";
                  uVar11 = 0x39e;
                  goto LAB_001aae97;
                }
                uVar4 = atoi(pcVar7 + 1);
                printf("%d: %s",(ulong)uVar4,local_438);
                if (0 < (int)uVar4) {
                  do {
                    pcVar7 = fgets(local_438,0x400,__stream);
                    if (local_438 != pcVar7) {
                      pcVar7 = "unable to read marker line";
                      uVar11 = 0x3a2;
                      goto LAB_001ab02a;
                    }
                    iVar5 = __isoc99_sscanf(local_438,"%d",&local_4f8);
                    if (iVar5 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                             ,0x3a3,"ref_import_su2","parse marker element type",1,(long)iVar5);
                      return 1;
                    }
                    if (local_4f8 == 3) {
                      iVar5 = __isoc99_sscanf(local_438,"%d %d %d",&local_4f8,&local_4d8,
                                              (long)&local_4d8 + 4);
                      if (iVar5 != 3) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x3bb,"ref_import_su2","parse marker element",3,(long)iVar5);
                        return 1;
                      }
                      local_4d0 = iVar3;
                      uVar6 = ref_cell_add(local_4f0->cell[0],(REF_INT *)&local_4d8,&local_4f4);
                      if (uVar6 != 0) {
                        uVar11 = 0x3be;
                        pcVar7 = "edg";
                        uVar2 = uVar6;
LAB_001aae33:
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,uVar11,"ref_import_su2",(ulong)uVar2,pcVar7);
                        uVar6 = uVar2;
                      }
                    }
                    else if (local_4f8 == 9) {
                      iVar5 = __isoc99_sscanf(local_438,"%d %d %d %d %d",&local_4f8,&local_4d8,
                                              (long)&local_4d8 + 4,&local_4d0,&local_4cc);
                      if (iVar5 != 5) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x3b2,"ref_import_su2","parse marker element",5,(long)iVar5);
                        return 1;
                      }
                      local_4cc = CONCAT44(iVar3,(undefined4)local_4cc);
                      uVar6 = ref_cell_add(local_4f0->cell[6],(REF_INT *)&local_4d8,&local_4f4);
                      if (uVar6 != 0) {
                        uVar11 = 0x3b5;
LAB_001aad6b:
                        pcVar7 = "tri";
                        uVar2 = uVar6;
                        goto LAB_001aae33;
                      }
                    }
                    else {
                      if (local_4f8 != 5) {
                        printf("cell_type = %d\n");
                        pcVar7 = "unknown SU2/VTK MARKER ELEM type";
                        uVar11 = 0x3c2;
                        goto LAB_001ab02a;
                      }
                      iVar5 = __isoc99_sscanf(local_438,"%d %d %d %d",&local_4f8,&local_4d8,
                                              (long)&local_4d8 + 4,&local_4d0);
                      if (iVar5 != 4) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x3a9,"ref_import_su2","parse marker element",4,(long)iVar5);
                        return 1;
                      }
                      local_4cc = CONCAT44(local_4cc._4_4_,iVar3);
                      uVar6 = ref_cell_add(local_4f0->cell[3],(REF_INT *)&local_4d8,&local_4f4);
                      if (uVar6 != 0) {
                        uVar11 = 0x3ac;
                        goto LAB_001aad6b;
                      }
                    }
                    if (uVar6 != 0) {
                      return uVar2;
                    }
                    uVar4 = uVar4 - 1;
                  } while (uVar4 != 0);
                }
                uVar12 = (ulong)(iVar3 + 1);
              } while (iVar3 != (int)local_460);
            }
          }
        }
      }
      fclose(__stream);
LAB_001aaeae:
      uVar2 = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x32d,
           "ref_import_su2",(ulong)uVar2,"create grid");
  }
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_import_su2(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi,
                                         const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  FILE *file;
  char line[1024];
  char *location;
  REF_INT ndime, npoin, nelem, nmark;
  REF_DBL x, y, z;
  REF_INT node, new_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], ncell, cell, new_cell, cell_type;
  REF_INT faceid;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  ndime = -1;
  while (!feof(file)) {
    if (line != fgets(line, 1024, file)) return REF_SUCCESS;
    location = strchr(line, '=');
    if (NULL == location) continue;
    if (NULL != strstr(line, "NDIME")) {
      ndime = atoi(location + 1);
      printf("NDIME %d\n", ndime);
      if (2 == ndime) {
        ref_grid_twod(ref_grid) = REF_TRUE;
      }
    }
    if (NULL != strstr(line, "NPOIN")) {
      npoin = atoi(location + 1);
      printf("NPOIN %d\n", npoin);
      for (node = 0; node < npoin; node++) {
        RAS(line == fgets(line, 1024, file), "unable to read point xyz line");
        if (2 == ndime) {
          REIS(2, sscanf(line, "%lf %lf", &x, &y), "parse xyz");
          RSS(ref_node_add(ref_node, node, &new_node), "add node");
          ref_node_xyz(ref_node, 0, new_node) = x;
          ref_node_xyz(ref_node, 1, new_node) = y;
          ref_node_xyz(ref_node, 2, new_node) = 0.0;
        } else {
          REIS(3, sscanf(line, "%lf %lf %lf", &x, &y, &z), "parse xyz");
          RSS(ref_node_add(ref_node, node, &new_node), "add node");
          ref_node_xyz(ref_node, 0, new_node) = x;
          ref_node_xyz(ref_node, 1, new_node) = y;
          ref_node_xyz(ref_node, 2, new_node) = z;
        }
      }
      RSS(ref_node_initialize_n_global(ref_node, npoin), "init glob");
    }
    if (NULL != strstr(line, "NELEM")) {
      nelem = atoi(location + 1);
      printf("NELEM %d\n", nelem);
      for (cell = 0; cell < nelem; cell++) {
        RAS(line == fgets(line, 1024, file), "unable to read element line");
        REIS(1, sscanf(line, "%d", &cell_type), "parse element type");
        switch (cell_type) {
          case VTK_TETRA:
            REIS(5,
                 sscanf(line, "%d %d %d %d %d", &cell_type, &(nodes[0]),
                        &(nodes[1]), &(nodes[2]), &(nodes[3])),
                 "parse element");
            RSS(ref_cell_add(ref_grid_tet(ref_grid), nodes, &new_cell), "tet");
            break;
          case VTK_PYRAMID:
            REIS(6,
                 sscanf(line, "%d %d %d %d %d %d", &cell_type, &(nodes[0]),
                        &(nodes[1]), &(nodes[2]), &(nodes[3]), &(nodes[4])),
                 "parse element");
            VTK_PYRAMID_TO_UGRID(nodes);
            RSS(ref_cell_add(ref_grid_pyr(ref_grid), nodes, &new_cell), "pyr");
            break;
          case VTK_WEDGE:
            REIS(7,
                 sscanf(line, "%d %d %d %d %d %d %d", &cell_type, &(nodes[0]),
                        &(nodes[1]), &(nodes[2]), &(nodes[3]), &(nodes[4]),
                        &(nodes[5])),
                 "parse element");
            VTK_WEDGE_TO_UGRID(nodes);
            RSS(ref_cell_add(ref_grid_pri(ref_grid), nodes, &new_cell), "tri");
            break;
          case VTK_HEXAHEDRON:
            REIS(9,
                 sscanf(line, "%d %d %d %d %d %d %d %d %d", &cell_type,
                        &(nodes[0]), &(nodes[1]), &(nodes[2]), &(nodes[3]),
                        &(nodes[4]), &(nodes[5]), &(nodes[6]), &(nodes[7])),
                 "parse element");
            RSS(ref_cell_add(ref_grid_hex(ref_grid), nodes, &new_cell), "tri");
            break;
          case VTK_TRIANGLE:
            REIS(4,
                 sscanf(line, "%d %d %d %d", &cell_type, &(nodes[0]),
                        &(nodes[1]), &(nodes[2])),
                 "parse marker element");
            nodes[3] = 0;
            RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &new_cell), "tri");
            break;
          case VTK_QUAD:
            REIS(5,
                 sscanf(line, "%d %d %d %d %d", &cell_type, &(nodes[0]),
                        &(nodes[1]), &(nodes[2]), &(nodes[3])),
                 "parse marker element");
            nodes[4] = 0;
            RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &new_cell), "tri");
            break;

          default:
            printf("cell_type = %d\n", cell_type);
            THROW("unknown SU2/VTK ELEM type");
        }
      }
    }
    if (NULL != strstr(line, "NMARK")) {
      nmark = atoi(location + 1);
      printf("NMARK %d\n", nmark);
      for (faceid = 1; faceid <= nmark; faceid++) {
        RAS(line == fgets(line, 1024, file), "unable to read marker tag");
        printf("%d: %s", faceid, line);
        RAS(NULL != strstr(line, "MARKER_TAG"), "MARKER_TAG not found");
        RAS(line == fgets(line, 1024, file), "unable to read marker elems");
        RAS(NULL != strstr(line, "MARKER_ELEMS"), "MARKER_ELEMS not found");
        location = strchr(line, '=');
        RNS(location, "MARKER_ELEMS missing =");
        ncell = atoi(location + 1);
        printf("%d: %s", ncell, line);
        for (cell = 0; cell < ncell; cell++) {
          RAS(line == fgets(line, 1024, file), "unable to read marker line");
          REIS(1, sscanf(line, "%d", &cell_type), "parse marker element type");
          switch (cell_type) {
            case VTK_TRIANGLE:
              REIS(4,
                   sscanf(line, "%d %d %d %d", &cell_type, &(nodes[0]),
                          &(nodes[1]), &(nodes[2])),
                   "parse marker element");
              nodes[3] = faceid;
              RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &new_cell),
                  "tri");
              break;
            case VTK_QUAD:
              REIS(5,
                   sscanf(line, "%d %d %d %d %d", &cell_type, &(nodes[0]),
                          &(nodes[1]), &(nodes[2]), &(nodes[3])),
                   "parse marker element");
              nodes[4] = faceid;
              RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &new_cell),
                  "tri");
              break;
            case VTK_LINE:
              REIS(3,
                   sscanf(line, "%d %d %d", &cell_type, &(nodes[0]),
                          &(nodes[1])),
                   "parse marker element");
              nodes[2] = faceid;
              RSS(ref_cell_add(ref_grid_edg(ref_grid), nodes, &new_cell),
                  "edg");
              break;
            default:
              printf("cell_type = %d\n", cell_type);
              THROW("unknown SU2/VTK MARKER ELEM type");
          }
        }
      }
    }
  }

  fclose(file);

  return REF_SUCCESS;
}